

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederateManager::registerEndpoint
          (MessageFederateManager *this,string_view name,string_view type)

{
  string_view message;
  string_view searchValue1;
  bool bVar1;
  unsigned_long *puVar2;
  undefined8 uVar3;
  undefined8 in_RCX;
  InterfaceHandle *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  optional<unsigned_long> oVar4;
  value_type *edat;
  handle datHandle;
  Endpoint *ref;
  optional<unsigned_long> loc;
  handle eptHandle;
  InterfaceHandle handle;
  lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  *in_stack_fffffffffffffee0;
  reference in_stack_fffffffffffffee8;
  Endpoint *in_stack_fffffffffffffef0;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar5;
  MessageFederate **in_stack_ffffffffffffff30;
  pointer in_stack_ffffffffffffff38;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  Endpoint *pEVar6;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  local_70 [2];
  undefined4 local_38;
  InterfaceHandle local_34 [9];
  InterfaceHandle *pIStack_10;
  Endpoint *local_8;
  
  local_38 = *(undefined4 *)(in_RDI + 0x170);
  pIStack_10 = in_RDX;
  local_34[0].hid =
       (**(code **)(**(long **)(in_RDI + 0x160) + 0x1a8))
                 (*(long **)(in_RDI + 0x160),local_38,in_RSI,in_RDX,in_RCX,in_R8);
  bVar1 = InterfaceHandle::isValid(local_34);
  if (bVar1) {
    in_stack_fffffffffffffef8 = local_70;
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(in_stack_ffffffffffffff18);
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator->(in_stack_fffffffffffffef8);
    searchValue1._M_str = in_stack_ffffffffffffff50;
    searchValue1._M_len = in_stack_ffffffffffffff48;
    oVar4 = gmlc::containers::
            DualStringMappedVector<helics::Endpoint,helics::InterfaceHandle,(reference_stability)0,5>
            ::
            insert<helics::MessageFederate*&,std::basic_string_view<char,std::char_traits<char>>&,helics::InterfaceHandle&>
                      (in_stack_ffffffffffffff40,searchValue1,
                       (InterfaceHandle *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                       (basic_string_view<char,_std::char_traits<char>_> *)
                       CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),pIStack_10);
    in_stack_ffffffffffffff07 =
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x36b7c8);
    if (bVar1) {
      gmlc::libguarded::
      lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
      ::operator->(local_70);
      in_stack_fffffffffffffef0 =
           gmlc::containers::
           DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
           ::back((DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
                   *)0x36b7e6);
      pEVar6 = in_stack_fffffffffffffef0;
      gmlc::libguarded::
      shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::lock((shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
              *)in_stack_ffffffffffffff18);
      gmlc::libguarded::
      lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::operator->((lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
                    *)&stack0xffffffffffffff38);
      in_stack_fffffffffffffee8 =
           std::
           deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
           ::emplace_back<>((deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>
                             *)in_stack_fffffffffffffee0);
      pEVar6->dataReference = in_stack_fffffffffffffee8;
      gmlc::libguarded::
      lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::unlock(in_stack_fffffffffffffee0);
      puVar2 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x36b859);
      pEVar6->referenceIndex = (int)*puVar2;
      iVar5 = 1;
      local_8 = pEVar6;
      gmlc::libguarded::
      lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::~lock_handle((lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
                      *)0x36b885);
    }
    else {
      iVar5 = 0;
    }
    gmlc::libguarded::
    lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                    *)0x36b8d2);
    if (iVar5 != 0) {
      return local_8;
    }
  }
  uVar3 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffef0,
             (char *)in_stack_fffffffffffffee8);
  message._M_str._0_7_ = in_stack_ffffffffffffff00;
  message._M_len = (size_t)in_stack_fffffffffffffef8;
  message._M_str._7_1_ = in_stack_ffffffffffffff07;
  RegistrationFailure::RegistrationFailure((RegistrationFailure *)in_stack_fffffffffffffef0,message)
  ;
  __cxa_throw(uVar3,&RegistrationFailure::typeinfo,RegistrationFailure::~RegistrationFailure);
}

Assistant:

Endpoint& MessageFederateManager::registerEndpoint(std::string_view name, std::string_view type)
{
    auto handle = coreObject->registerEndpoint(fedID, name, type);
    if (handle.isValid()) {
        auto eptHandle = mLocalEndpoints.lock();
        auto loc = eptHandle->insert(name, handle, mFed, name, handle);
        if (loc) {
            auto& ref = eptHandle->back();
            auto datHandle = eptData.lock();
            auto& edat = datHandle->emplace_back();

            // non-owning pointer
            ref.dataReference = &edat;
            datHandle.unlock();
            ref.referenceIndex = static_cast<int>(*loc);

            return ref;
        }
    }
    throw(RegistrationFailure("Unable to register Endpoint"));
}